

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_Write3dmBufferArchive::Internal_SeekFromCurrentPositionOverride
          (ON_Write3dmBufferArchive *this,int offset)

{
  if (this->m_buffer == (uchar *)0x0) {
    return false;
  }
  if (offset < 0) {
    if (this->m_buffer_position < (ulong)(uint)-offset) {
      return false;
    }
    this->m_buffer_position = this->m_buffer_position - (ulong)(uint)-offset;
  }
  else {
    this->m_buffer_position = this->m_buffer_position + (ulong)(uint)offset;
  }
  return true;
}

Assistant:

bool ON_Write3dmBufferArchive::Internal_SeekFromCurrentPositionOverride( int offset )
{
  bool rc = false;
  if ( m_buffer )
  {
    if (offset >= 0 )
    {
      m_buffer_position += offset;
      rc = true;
    }
    else if ( size_t(-offset) <= m_buffer_position )
    {
      m_buffer_position -= (size_t(-offset));
      rc = true;
    }
  }
  return rc;
}